

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

int8_t bf_get_int8(bfile_t *bfile)

{
  bool_t bVar1;
  bfile_t *in_RDI;
  int bufpos;
  int8_t val;
  bfile_t *in_stack_00000020;
  uint8_t local_1;
  
  bVar1 = bf_at_eof(in_RDI);
  if (bVar1 == 0) {
    if (in_RDI->ipos == in_RDI->pos) {
      bf_read_buffer(in_stack_00000020);
    }
    local_1 = in_RDI->buffer[(int)(in_RDI->pos % (ulong)in_RDI->buffer_size)];
    in_RDI->pos = in_RDI->pos + 1;
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

int8_t
bf_get_int8(
    bfile_t * bfile )
{
    int8_t val;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    if ( bf_at_eof( bfile ) != FALSE )
        return 0;

    if ( (bfile->ipos - bfile->pos) < 1 ) 
        bf_read_buffer( bfile );

    bufpos = bfile->pos % bfile->buffer_size;
    val =((int8_t *)(bfile->buffer))[bufpos];
    bfile->pos++;
    return val;
}